

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int is_prime(int num)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 2;
  iVar1 = 2;
  if (2 < num) {
    iVar1 = num;
  }
  for (; (iVar2 = iVar1, iVar3 < num && (iVar2 = iVar3, num % iVar3 != 0)); iVar3 = iVar3 + 1) {
  }
  return (int)(iVar2 == num);
}

Assistant:

int is_prime(int num) {
	int i;
	for (i = 2; i < num; i++) {
		if ((num % i) == 0) {
			break;
		}
	}
	if (i == num) {
		return 1;
	}
	return 0;
}